

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::ValueFlag<unsigned_int,_args::ValueReader>::ParseValue
          (ValueFlag<unsigned_int,_args::ValueReader> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values_)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *value_;
  uint *in_stack_00000358;
  string *in_stack_00000360;
  string *in_stack_00000368;
  ValueReader *in_stack_00000370;
  size_type in_stack_ffffffffffffffd8;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at(in_RDI,in_stack_ffffffffffffffd8);
  ValueReader::operator()(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_00000358);
  return;
}

Assistant:

virtual void ParseValue(const std::vector<std::string> &values_) override
            {
                const std::string &value_ = values_.at(0);

#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
            }